

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O3

Rational * soplex::ratFromString(Rational *__return_storage_ptr__,char *desc)

{
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  *this;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  char cVar1;
  uint uVar2;
  _Iter_comp_to_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scipopt[P]soplex_src_soplex_rational_h:163:17),___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __pred;
  _Iter_comp_to_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scipopt[P]soplex_src_soplex_rational_h:163:17),___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __pred_00;
  long lVar3;
  rational_type *prVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  uint *puVar10;
  ulong uVar11;
  undefined8 uVar12;
  long lVar13;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var14;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var15;
  string den;
  string s;
  unkbyte10 in_stack_fffffffffffffee8;
  undefined6 in_stack_fffffffffffffef2;
  data_type local_f8;
  undefined4 local_e8;
  undefined1 uStack_e4;
  char cStack_e3;
  char cStack_e2;
  undefined1 uStack_e1;
  data_type local_d8;
  undefined4 local_c8;
  undefined2 local_c4;
  char local_c2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  long local_b0;
  long local_a8 [2];
  long local_98;
  double local_90;
  long *local_88;
  unsigned_long_long *local_80 [2];
  unsigned_long_long local_70 [2];
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *local_60;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->m_backend).m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  (__return_storage_ptr__->m_backend).m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar4 = &(__return_storage_ptr__->m_backend).m_value;
  (prVar4->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar4->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (__return_storage_ptr__->m_backend).m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (__return_storage_ptr__->m_backend).m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 1;
  (__return_storage_ptr__->m_backend).m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar4 = &(__return_storage_ptr__->m_backend).m_value;
  (prVar4->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar4->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (__return_storage_ptr__->m_backend).m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  iVar6 = strcmp(desc,"inf");
  if (iVar6 == 0) {
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                 *)__return_storage_ptr__,(longdouble)1e+100);
    return __return_storage_ptr__;
  }
  iVar6 = strcmp(desc,"-inf");
  if (iVar6 == 0) {
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                 *)__return_storage_ptr__,(longdouble)-1e+100);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)&local_b8,desc,(allocator *)&local_f8.ld);
  this = &(__return_storage_ptr__->m_backend).m_value.den;
  lVar8 = std::__cxx11::string::find_first_of((char *)&local_b8,0x3584a6,0);
  if (lVar8 == -1) {
    if (*local_b8._M_current == '+') {
      local_f8.la[0] = 0;
      local_e8 = 1;
      uStack_e4 = 0;
      cStack_e3 = '\x01';
      cStack_e2 = '\0';
      local_d8.la[0] = 1;
      local_c8 = 1;
      local_c4 = 0x100;
      local_c2 = '\0';
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)&local_f8.ld,desc + 1);
    }
    else {
      local_f8.la[0] = 0;
      local_e8 = 1;
      uStack_e4 = 0;
      cStack_e3 = '\x01';
      cStack_e2 = '\0';
      local_d8.la[0] = 1;
      local_c8 = 1;
      local_c4 = 0x100;
      local_c2 = '\0';
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)&local_f8.ld,desc);
    }
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)__return_storage_ptr__,
                (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)&local_f8.ld);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)this,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                         *)&local_d8.ld);
    if ((local_c4._1_1_ == '\0') && (local_c2 == '\0')) {
      operator_delete(local_d8.ld.data,(local_d8.la[0] & 0xffffffff) << 3);
    }
    if ((cStack_e3 == '\0') && (cStack_e2 == '\0')) {
      operator_delete(local_f8.ld.data,(local_f8.la[0] & 0xffffffff) << 3);
    }
    goto LAB_001ab6e6;
  }
  local_f8.la[0] = (limb_type)&local_e8;
  local_60 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"e","");
  _Var14._M_current = local_b8._M_current;
  uVar5 = local_f8.ld.data;
  uVar12 = local_f8.la[0];
  lVar8 = local_b0;
  _Var15._M_current = local_b8._M_current;
  if (local_f8.ld.data != (unsigned_long_long *)0x0 && local_b0 != 0) {
    local_98 = local_b0;
    __last._M_current = local_b8._M_current + local_b0;
    __pred._M_it1._M_current._2_6_ = in_stack_fffffffffffffef2;
    __pred._0_10_ = in_stack_fffffffffffffee8;
    _Var9 = std::
            __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_to_iter<soplex::findSubStringIC(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                      (local_b8,__last,__pred);
    lVar8 = local_98;
    _Var15 = _Var9;
    if (((unsigned_long_long *)uVar5 != (unsigned_long_long *)0x1) &&
       (_Var15._M_current = __last._M_current, _Var9._M_current != __last._M_current)) {
      local_90 = (double)(2 - uVar5);
      local_88 = (long *)_Var14._M_current;
      while (lVar8 = local_98, _Var14._M_current = (char *)local_88,
            _Var15._M_current = __last._M_current, _Var9._M_current + 1 != __last._M_current) {
        lVar13 = 1;
        local_58._M_current = _Var9._M_current + 1;
        while( true ) {
          cVar1 = *(char *)(uVar12 + lVar13);
          iVar6 = toupper((int)_Var9._M_current[lVar13]);
          iVar7 = toupper((int)cVar1);
          if (iVar6 != iVar7) break;
          lVar8 = local_98;
          _Var14._M_current = (char *)local_88;
          _Var15._M_current = _Var9._M_current;
          if (((long)local_90 + lVar13 == 1) ||
             (lVar3 = lVar13 + 1, lVar13 = lVar13 + 1, _Var15._M_current = __last._M_current,
             _Var9._M_current + lVar3 == __last._M_current)) goto LAB_001ab1ef;
        }
        __pred_00._M_it1._M_current._2_6_ = in_stack_fffffffffffffef2;
        __pred_00._0_10_ = in_stack_fffffffffffffee8;
        _Var9 = std::
                __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_to_iter<soplex::findSubStringIC(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                          (local_58,__last,__pred_00);
        lVar8 = local_98;
        _Var14._M_current = (char *)local_88;
        _Var15._M_current = __last._M_current;
        if (_Var9._M_current == __last._M_current) break;
      }
    }
  }
LAB_001ab1ef:
  if ((undefined4 *)uVar12 != &local_e8) {
    operator_delete((void *)uVar12,
                    CONCAT17(uStack_e1,
                             CONCAT16(cStack_e2,CONCAT15(cStack_e3,CONCAT14(uStack_e4,local_e8)))) +
                    1);
    lVar8 = local_b0;
    _Var14._M_current = local_b8._M_current;
  }
  if (_Var15._M_current == _Var14._M_current + lVar8) {
    local_90 = 0.0;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_b8);
    uVar12 = local_f8.la[0];
    puVar10 = (uint *)__errno_location();
    uVar2 = *puVar10;
    *puVar10 = 0;
    lVar8 = strtol((char *)uVar12,(char **)local_80,10);
    if (local_80[0] == (unsigned_long_long *)uVar12) {
      std::__throw_invalid_argument("stoi");
LAB_001ab722:
      uVar12 = std::__throw_out_of_range("stoi");
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      if ((undefined4 *)local_f8.la[0] != &local_e8) {
        operator_delete((void *)local_f8.la[0],
                        CONCAT17(uStack_e1,
                                 CONCAT16(cStack_e2,CONCAT15(cStack_e3,CONCAT14(uStack_e4,local_e8))
                                         )) + 1);
      }
      if ((long *)local_b8._M_current != local_a8) {
        operator_delete(local_b8._M_current,local_a8[0] + 1);
      }
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)(ulong)uVar2);
      _Unwind_Resume(uVar12);
    }
    if (((int)lVar8 != lVar8) || (*puVar10 == 0x22)) goto LAB_001ab722;
    if (*puVar10 == 0) {
      *puVar10 = uVar2;
    }
    if ((undefined4 *)local_f8.la[0] != &local_e8) {
      operator_delete((void *)local_f8.la[0],
                      CONCAT17(uStack_e1,
                               CONCAT16(cStack_e2,CONCAT15(cStack_e3,CONCAT14(uStack_e4,local_e8))))
                      + 1);
    }
    std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_b8);
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_f8.ld);
    if ((undefined4 *)local_f8.la[0] != &local_e8) {
      operator_delete((void *)local_f8.la[0],
                      CONCAT17(uStack_e1,
                               CONCAT16(cStack_e2,CONCAT15(cStack_e3,CONCAT14(uStack_e4,local_e8))))
                      + 1);
    }
    local_90 = (double)(int)lVar8;
    _Var14._M_current = local_b8._M_current;
  }
  if ((char)*(long *)_Var14._M_current == '.') {
    std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x3599b4);
  }
  uVar11 = std::__cxx11::string::find((char)&local_b8,0x2e);
  if (uVar11 != 0xffffffffffffffff) {
    lVar8 = ~uVar11 + local_b0;
    local_f8.la[0] = (limb_type)&local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"1","");
    if (lVar8 != 0) {
      do {
        std::__cxx11::string::append((char *)local_f8.la);
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    std::__cxx11::string::erase((ulong)&local_b8,uVar11);
    if (*local_b8._M_current == '-') {
      std::__cxx11::string::substr((ulong)local_80,(ulong)&local_b8);
      uVar11 = std::__cxx11::string::find_first_not_of((char)local_80,0x30);
      if (uVar11 < local_b0 - 1U) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_b8);
        std::__cxx11::string::find_first_not_of((char)local_50,0x30);
      }
      std::__cxx11::string::erase((ulong)&local_b8,1);
      if ((uVar11 < local_b0 - 1U) && (local_50[0] != local_40)) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
    }
    else {
      uVar11 = std::__cxx11::string::find_first_not_of((char)&local_b8,0x30);
      if (uVar11 < local_b0 - 1U) {
        std::__cxx11::string::find_first_not_of((char)&local_b8,0x30);
      }
      std::__cxx11::string::erase((ulong)&local_b8,0);
    }
    std::__cxx11::string::append((char *)&local_b8);
    std::__cxx11::string::_M_append((char *)&local_b8,local_f8.la[0]);
    if ((undefined4 *)local_f8.la[0] != &local_e8) {
      operator_delete((void *)local_f8.la[0],
                      CONCAT17(uStack_e1,
                               CONCAT16(cStack_e2,CONCAT15(cStack_e3,CONCAT14(uStack_e4,local_e8))))
                      + 1);
    }
  }
  if (*local_b8._M_current == '+') {
    std::__cxx11::string::substr((ulong)local_80,(ulong)&local_b8);
    local_f8.la[0] = 0;
    local_e8 = 1;
    uStack_e4 = 0;
    cStack_e3 = '\x01';
    cStack_e2 = '\0';
    local_d8.la[0] = 1;
    local_c8 = 1;
    local_c4 = 0x100;
    local_c2 = '\0';
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)&local_f8.ld,(char *)local_80[0]);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)__return_storage_ptr__,
                (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)&local_f8.ld);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::operator=(local_60,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                          *)&local_d8.ld);
    if ((local_c4._1_1_ == '\0') && (local_c2 == '\0')) {
      operator_delete(local_d8.ld.data,(local_d8.la[0] & 0xffffffff) << 3);
    }
    if ((cStack_e3 == '\0') && (cStack_e2 == '\0')) {
      operator_delete(local_f8.ld.data,(local_f8.la[0] & 0xffffffff) << 3);
    }
    if (local_80[0] != local_70) {
      uVar11 = local_70[0] + 1;
LAB_001ab6ba:
      operator_delete(local_80[0],uVar11);
    }
  }
  else {
    local_f8.la[0] = 0;
    local_e8 = 1;
    uStack_e4 = 0;
    cStack_e3 = '\x01';
    cStack_e2 = '\0';
    local_d8.la[0] = 1;
    local_c8 = 1;
    local_c4 = 0x100;
    local_c2 = '\0';
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)&local_f8.ld,local_b8._M_current);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)__return_storage_ptr__,
                (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)&local_f8.ld);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::operator=(local_60,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                          *)&local_d8.ld);
    if ((local_c4._1_1_ == '\0') && (local_c2 == '\0')) {
      operator_delete(local_d8.ld.data,(local_d8.la[0] & 0xffffffff) << 3);
    }
    if ((cStack_e3 == '\0') && (cStack_e2 == '\0')) {
      uVar11 = (local_f8.la[0] & 0xffffffff) << 3;
      local_80[0] = local_f8.ld.data;
      goto LAB_001ab6ba;
    }
  }
  local_f8.la[0] = (limb_type)pow(10.0,local_90);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
  ::operator*=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                *)__return_storage_ptr__,(double *)local_f8.la);
LAB_001ab6e6:
  if ((long *)local_b8._M_current != local_a8) {
    operator_delete(local_b8._M_current,local_a8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Rational ratFromString(const char* desc)
{
   Rational res;

   if(0 == strcmp(desc, "inf"))
   {
      res = 1e100;
   }
   else if(0 == strcmp(desc, "-inf"))
   {
      res = -1e100;
   }
   else
   {
      std::string s(desc);

      /* case 1: string is given in nom/den format */
      if(s.find_first_of(".Ee") == std::string::npos)
      {
         if(s[0] == '+')
            res = Rational(desc + 1);
         else
            res = Rational(desc);
      }
      /* case 2: string is given as base-10 decimal number */
      else
      {
         std::string::const_iterator it = findSubStringIC("e", s);
         int mult = 0;

         if(it != s.end())
         {
            int exponentidx = int(it - s.begin());
            mult = std::stoi(s.substr(exponentidx + 1, s.length()));
            s = s.substr(0, exponentidx);
         }

         // std::cout << s << std::endl;
         if(s[0] == '.')
            s.insert(0, "0");

         size_t pos = s.find('.');

         // if s contains a ., convert it to a rational
         if(pos != std::string::npos)
         {
            size_t exp = s.length() - 1 - pos;
            std::string den("1");

            for(size_t i = 0; i < exp; ++i)
               den.append("0");

            s.erase(pos, 1);
            assert(std::all_of(s.begin() + 1, s.end(), ::isdigit));

            // remove padding 0s
            if(s[0] == '-')
               s.erase(1, SOPLEX_MIN(s.substr(1).find_first_not_of('0'), s.size() - 1));
            else
               s.erase(0, SOPLEX_MIN(s.find_first_not_of('0'), s.size() - 1));

            s.append("/");
            s.append(den);
         }

         if(s[0] == '+')
            res = Rational(s.substr(1));
         else
            res = Rational(s);

         res *= pow(10, mult);
      }
   }

   return res;
}